

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

void libcellml::findAndReplaceComponentsCnUnitsNames
               (ComponentPtr *component,string *oldName,string *newName)

{
  size_t sVar1;
  ulong uVar2;
  ComponentPtr childComponent;
  ComponentEntity local_40;
  
  findAndReplaceComponentCnUnitsNames(component,oldName,newName);
  uVar2 = 0;
  while( true ) {
    sVar1 = ComponentEntity::componentCount
                      (&((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ComponentEntity);
    if (sVar1 <= uVar2) break;
    ComponentEntity::component
              (&local_40,
               (size_t)(component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    findAndReplaceComponentCnUnitsNames((ComponentPtr *)&local_40,oldName,newName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void findAndReplaceComponentsCnUnitsNames(const ComponentPtr &component, const std::string &oldName, const std::string &newName)
{
    findAndReplaceComponentCnUnitsNames(component, oldName, newName);
    for (size_t index = 0; index < component->componentCount(); ++index) {
        auto childComponent = component->component(index);
        findAndReplaceComponentCnUnitsNames(childComponent, oldName, newName);
    }
}